

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O2

void __thiscall wasm::RemoveNonJSOpsPass::doWalkFunction(RemoveNonJSOpsPass *this,Function *func)

{
  Module *pMVar1;
  pointer __p;
  pointer __p_00;
  __uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> local_30;
  
  if ((this->builder)._M_t.super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
      ._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl == (Builder *)0x0) {
    pMVar1 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
             ).
             super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             .super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             .currModule;
    __p_00 = (pointer)operator_new(8);
    __p_00->wasm = pMVar1;
    local_30._M_t.super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
    super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl =
         (tuple<wasm::Builder_*,_std::default_delete<wasm::Builder>_>)
         (_Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>)0x0;
    std::__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>::reset
              ((__uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&this->builder
               ,__p_00);
    std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::~unique_ptr
              ((unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *)&local_30);
  }
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::walk
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,&func->body);
  return;
}

Assistant:

void doWalkFunction(Function* func) {
    if (!builder) {
      builder = std::make_unique<Builder>(*getModule());
    }
    PostWalker<RemoveNonJSOpsPass>::doWalkFunction(func);
  }